

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::to_pixels_resize(Mat *this,uchar *pixels,int type,int target_width,int target_height)

{
  uint in_EDX;
  int type_to;
  int in_stack_00000108;
  int in_stack_0000010c;
  int in_stack_00000110;
  int in_stack_00000114;
  uchar *in_stack_00000118;
  Mat *in_stack_00000120;
  undefined4 local_2c;
  
  if ((in_EDX & 0xffff0000) == 0) {
    local_2c = in_EDX & 0xffff;
  }
  else {
    local_2c = (int)in_EDX >> 0x10;
  }
  if ((local_2c == 1) || (local_2c == 2)) {
    to_pixels_resize(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110,
                     in_stack_0000010c,in_stack_00000108);
  }
  else if (local_2c == 3) {
    to_pixels_resize(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110,
                     in_stack_0000010c,in_stack_00000108);
  }
  else if (local_2c == 4) {
    to_pixels_resize(in_stack_00000120,in_stack_00000118,in_stack_00000114,in_stack_00000110,
                     in_stack_0000010c,in_stack_00000108);
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height) const
{
    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 3);
    }
    else if (type_to == PIXEL_GRAY)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 1);
    }
    else if (type_to == PIXEL_RGBA)
    {
        to_pixels_resize(pixels, type, target_width, target_height, target_width * 4);
    }
}